

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

void sat_solver3_set_resource_limits
               (sat_solver3 *s,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,
               ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  long lVar1;
  
  s->nRestarts = 0;
  s->nConfLimit = 0;
  s->nInsLimit = 0;
  if (nConfLimit != 0) {
    s->nConfLimit = nConfLimit + (s->stats).conflicts;
  }
  if (nInsLimit != 0) {
    s->nInsLimit = nInsLimit + (s->stats).propagations;
  }
  if ((nConfLimitGlobal != 0) && (lVar1 = s->nConfLimit, lVar1 == 0 || nConfLimitGlobal < lVar1)) {
    s->nConfLimit = nConfLimitGlobal;
  }
  if ((nInsLimitGlobal != 0) && (s->nInsLimit == 0 || nInsLimitGlobal < s->nInsLimit)) {
    s->nInsLimit = nInsLimitGlobal;
  }
  return;
}

Assistant:

void sat_solver3_set_resource_limits(sat_solver3* s, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    // set the external limits
    s->nRestarts  = 0;
    s->nConfLimit = 0;
    s->nInsLimit  = 0;
    if ( nConfLimit )
        s->nConfLimit = s->stats.conflicts + nConfLimit;
    if ( nInsLimit )
//        s->nInsLimit = s->stats.inspects + nInsLimit;
        s->nInsLimit = s->stats.propagations + nInsLimit;
    if ( nConfLimitGlobal && (s->nConfLimit == 0 || s->nConfLimit > nConfLimitGlobal) )
        s->nConfLimit = nConfLimitGlobal;
    if ( nInsLimitGlobal && (s->nInsLimit == 0 || s->nInsLimit > nInsLimitGlobal) )
        s->nInsLimit = nInsLimitGlobal;
}